

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O1

void __thiscall
jpge::jpeg_encoder::emit_dht(jpeg_encoder *this,uint8 *bits,uint8 *val,int index,bool ac_flag)

{
  undefined1 uVar1;
  undefined8 in_RAX;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  undefined8 uStack_38;
  int iVar2;
  
  uStack_38 = in_RAX;
  emit_marker(this,0xc4);
  lVar3 = 0;
  uVar4 = 0;
  do {
    uVar4 = uVar4 + bits[lVar3 + 1];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  emit_word(this,uVar4 + 0x13);
  uStack_38._0_6_ = CONCAT15(ac_flag * '\x10' + (char)index,(undefined5)uStack_38);
  if (this->m_all_stream_writes_succeeded == true) {
    iVar2 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,(long)&uStack_38 + 5,1);
    uVar1 = (undefined1)iVar2;
  }
  else {
    uVar1 = false;
  }
  this->m_all_stream_writes_succeeded = (bool)uVar1;
  lVar3 = 0;
  do {
    uStack_38._0_7_ = CONCAT16(bits[lVar3 + 1],(undefined6)uStack_38);
    if (this->m_all_stream_writes_succeeded == true) {
      iVar2 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,(long)&uStack_38 + 6,1);
      uVar1 = (undefined1)iVar2;
    }
    else {
      uVar1 = false;
    }
    this->m_all_stream_writes_succeeded = (bool)uVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  if (uVar4 != 0) {
    uVar5 = 0;
    do {
      uStack_38 = CONCAT17(val[uVar5],(undefined7)uStack_38);
      if (this->m_all_stream_writes_succeeded == true) {
        iVar2 = (*this->m_pStream->_vptr_output_stream[2])(this->m_pStream,(long)&uStack_38 + 7,1);
        uVar1 = (undefined1)iVar2;
      }
      else {
        uVar1 = false;
      }
      this->m_all_stream_writes_succeeded = (bool)uVar1;
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  return;
}

Assistant:

void jpeg_encoder::emit_dht(uint8* bits, uint8* val, int index, bool ac_flag)
	{
		emit_marker(M_DHT);

		int length = 0;
		for (int i = 1; i <= 16; i++)
			length += bits[i];

		emit_word(length + 2 + 1 + 16);
		emit_byte(static_cast<uint8>(index + (ac_flag << 4)));

		for (int i = 1; i <= 16; i++)
			emit_byte(bits[i]);

		for (int i = 0; i < length; i++)
			emit_byte(val[i]);
	}